

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

void __thiscall CaDiCaL::Proof::strengthen(Proof *this)

{
  pointer ppTVar1;
  Tracer **tracer;
  pointer ppTVar2;
  
  ppTVar1 = (this->tracers).
            super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar2 = (this->tracers).
                 super__Vector_base<CaDiCaL::Tracer_*,_std::allocator<CaDiCaL::Tracer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar2 != ppTVar1; ppTVar2 = ppTVar2 + 1) {
    (*(*ppTVar2)->_vptr_Tracer[6])(*ppTVar2,this->clause_id);
  }
  this->clause_id = 0;
  return;
}

Assistant:

void Proof::strengthen () {
  LOG ("PROOF strengthen clause with id %" PRId64, clause_id);
  for (auto &tracer : tracers) {
    tracer->strengthen (clause_id);
  }
  clause_id = 0;
}